

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * helics::helicsGetVector(string_view val)

{
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *vectorVal;
  vector<double,_std::allocator<double>_> *in_stack_000000b0;
  undefined1 in_stack_000000b8 [16];
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3ef919);
  helicsGetVector((string_view)in_stack_000000b8,in_stack_000000b0);
  return in_RDI;
}

Assistant:

std::vector<double> helicsGetVector(std::string_view val)
{
    std::vector<double> vectorVal;
    helicsGetVector(val, vectorVal);
    return vectorVal;
}